

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_cvtd_s_mips64(CPUMIPSState_conflict5 *env,uint32_t fst0)

{
  float64 fVar1;
  uintptr_t unaff_retaddr;
  uint64_t fdt2;
  uint32_t fst0_local;
  CPUMIPSState_conflict5 *env_local;
  
  fVar1 = float32_to_float64_mips64(fst0,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

uint64_t helper_float_cvtd_s(CPUMIPSState *env, uint32_t fst0)
{
    uint64_t fdt2;

    fdt2 = float32_to_float64(fst0, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return fdt2;
}